

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O0

void __thiscall
Editor::Editor(Editor *this,Board *board,RenderWindow *window,MessageLogSinkMt *messageLogSink)

{
  int iVar1;
  View *this_00;
  Vector2f *vector;
  Editor *this_01;
  uint characterSize;
  long in_RDX;
  _func_int **in_RSI;
  Drawable *in_RDI;
  StaticInit *in_stack_00000200;
  MessageLogSinkMt *in_stack_000004d8;
  RenderWindow *in_stack_000004e0;
  Editor *in_stack_000004e8;
  EditorInterface *in_stack_000004f0;
  undefined4 in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  OffsetView *in_stack_fffffffffffffed0;
  Shape *this_02;
  Vector2f *in_stack_fffffffffffffed8;
  Color *color;
  RectangleShape *in_stack_fffffffffffffee0;
  format fmt;
  Text *pTVar2;
  char (*in_stack_fffffffffffffee8) [23];
  path *in_stack_fffffffffffffef0;
  String *string;
  pair<sf::Vector2<int>,_bool> *this_03;
  SubBoard *this_04;
  Color local_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [47];
  bool local_49;
  Vector2<int> local_48;
  bool local_3d;
  Vector2<int> local_3c;
  Vector2<float> local_34 [3];
  long local_18;
  _func_int **local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  sf::Drawable::Drawable(in_RDI);
  in_RDI->_vptr_Drawable = (_func_int **)&PTR__Editor_0047d880;
  EditorInterface::EditorInterface
            (in_stack_000004f0,in_stack_000004e8,in_stack_000004e0,in_stack_000004d8);
  in_RDI[0xf]._vptr_Drawable = local_10;
  ghc::filesystem::current_path();
  OffsetView::OffsetView(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  *(undefined4 *)((long)&in_RDI[0x2a]._vptr_Drawable + 4) = 0x3f800000;
  sf::Vector2<int>::Vector2((Vector2<int> *)(in_RDI + 0x2b));
  *(undefined1 *)&in_RDI[0x2c]._vptr_Drawable = 0;
  *(undefined1 *)((long)&in_RDI[0x2c]._vptr_Drawable + 1) = 0;
  this_00 = sf::RenderTarget::getDefaultView((RenderTarget *)(local_18 + 0x30));
  vector = sf::View::getSize(this_00);
  sf::Vector2<unsigned_int>::Vector2<float>
            ((Vector2<unsigned_int> *)((long)&in_RDI[0x2c]._vptr_Drawable + 4),vector);
  sf::Vector2<float>::Vector2(local_34,32.0,32.0);
  sf::RectangleShape::RectangleShape(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  fmt = (format)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  this_04 = (SubBoard *)(in_RDI + 0x59);
  sf::Vector2<int>::Vector2(&local_3c);
  local_3d = false;
  std::pair<sf::Vector2<int>,_bool>::pair<sf::Vector2<int>,_bool,_true>
            ((pair<sf::Vector2<int>,_bool> *)this_04,&local_3c,&local_3d);
  *(undefined4 *)((long)&in_RDI[0x5a]._vptr_Drawable + 4) = 0;
  *(undefined1 *)&in_RDI[0x5b]._vptr_Drawable = 0;
  this_03 = (pair<sf::Vector2<int>,_bool> *)((long)&in_RDI[0x5b]._vptr_Drawable + 4);
  sf::Vector2<int>::Vector2(&local_48);
  local_49 = false;
  std::pair<sf::Vector2<int>,_bool>::pair<sf::Vector2<int>,_bool,_true>(this_03,&local_48,&local_49)
  ;
  sf::Vector2<int>::Vector2((Vector2<int> *)(in_RDI + 0x5d));
  string = (String *)(in_RDI + 0x5e);
  pTVar2 = (Text *)local_78;
  std::locale::locale((locale *)pTVar2);
  sf::String::String((String *)this_04,(char *)this_03,(locale *)pTVar2);
  this_01 = (Editor *)Locator::getResource();
  ghc::filesystem::path::path<char[23],ghc::filesystem::path>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,fmt);
  (*(this_01->super_Drawable)._vptr_Drawable[3])(this_01,local_98);
  sf::Text::Text(pTVar2,string,(Font *)this_01,characterSize);
  ghc::filesystem::path::~path((path *)0x18d9d7);
  sf::String::~String((String *)0x18d9e4);
  std::locale::~locale((locale *)local_78);
  sf::Vector2<int>::Vector2((Vector2<int> *)(in_RDI + 0x8c));
  *(undefined1 *)&in_RDI[0x8d]._vptr_Drawable = 0;
  *(undefined1 *)((long)&in_RDI[0x8d]._vptr_Drawable + 1) = 1;
  SubBoard::SubBoard(this_04);
  SubBoard::SubBoard(this_04);
  pTVar2 = (Text *)(in_RDI + 0x152);
  TilePool::TilePool((TilePool *)in_stack_fffffffffffffed0);
  color = (Color *)(in_RDI + 0x158);
  in_RDI[0x160]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x161]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15e]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15f]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15c]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15d]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15a]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x15b]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x158]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x159]._vptr_Drawable = (_func_int **)0x0;
  std::
  deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
  ::deque((deque<std::unique_ptr<Command,_std::default_delete<Command>_>,_std::allocator<std::unique_ptr<Command,_std::default_delete<Command>_>_>_>
           *)0x18daa8);
  in_RDI[0x162]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x163]._vptr_Drawable = (_func_int **)0x0;
  in_RDI[0x164]._vptr_Drawable = (_func_int **)0x0;
  if (Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::staticInit == '\0') {
    iVar1 = __cxa_guard_acquire(&Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::
                                 staticInit);
    if (iVar1 != 0) {
      StaticInit::StaticInit(in_stack_00000200);
      __cxa_guard_release(&Editor(Board&,sf::RenderWindow&,MessageLogSink<std::mutex>*)::staticInit)
      ;
    }
  }
  staticInit_ = &Editor::staticInit;
  defaultZoom(this_01);
  this_02 = (Shape *)(in_RDI + 0x2e);
  sf::Color::Color(&local_9c,0xff,'P',0xff,'d');
  sf::Shape::setFillColor
            (this_02,(Color *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  sf::Text::setOutlineColor(pTVar2,color);
  sf::Text::setOutlineThickness((Text *)(in_RDI + 0x5e),2.0);
  return;
}

Assistant:

Editor::Editor(Board& board, sf::RenderWindow& window, MessageLogSinkMt* messageLogSink) :
    interface_(*this, window, messageLogSink),
    board_(board),
    workingDirectory_(fs::current_path()),
    editView_(static_cast<float>(TileWidth::TEXELS * Chunk::WIDTH)),
    zoomLevel_(1.0f),
    mousePos_(),
    mouseLeftIsDragging_(false),
    mouseOnScreen_(false),
    windowSize_(window.getDefaultView().getSize()),
    cursor_({static_cast<float>(TileWidth::TEXELS), static_cast<float>(TileWidth::TEXELS)}),
    cursorCoords_({sf::Vector2i(), false}),
    cursorState_(CursorState::empty),
    cursorVisible_(false),
    selectionStart_({sf::Vector2i(), false}),
    selectionEnd_(),
    wireToolLabel_("", Locator::getResource()->getFont("resources/consolas.ttf"), 22),
    wireToolStart_(),
    wireToolVerticalFirst_(false),
    wireToolWireState_(State::low),
    tileSubBoard_(),
    copySubBoard_(),
    tilePool_(),
    editHistory_(),
    maxEditHistory_(0),
    lastEditSize_(0),
    savedEditSize_(0) {

    static StaticInit staticInit;
    staticInit_ = &staticInit;

    defaultZoom();
    cursor_.setFillColor({255, 80, 255, 100});
    wireToolLabel_.setOutlineColor(sf::Color::Black);
    wireToolLabel_.setOutlineThickness(2.0f);
}